

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Literals * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::getGlobal
          (ModuleRunnerBase<wasm::ModuleRunner> *this,Name name)

{
  Global *__k;
  mapped_type *pmVar1;
  Export *pEVar2;
  mapped_type *pmVar3;
  char *pcVar4;
  size_t sVar5;
  Module *this_00;
  Name name_00;
  
  pcVar4 = name.super_IString.str._M_str;
  sVar5 = name.super_IString.str._M_len;
  this_00 = this->wasm;
  while( true ) {
    name_00.super_IString.str._M_str = pcVar4;
    name_00.super_IString.str._M_len = sVar5;
    __k = Module::getGlobal(this_00,name_00);
    if ((__k->super_Importable).module.super_IString.str._M_str == (char *)0x0) break;
    pmVar1 = std::
             map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
             ::at(&this->linkedInstances,&(__k->super_Importable).module);
    this = &((pmVar1->super___shared_ptr<wasm::ModuleRunner,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            super_ModuleRunnerBase<wasm::ModuleRunner>;
    pEVar2 = Module::getExport(this->wasm,(Name)(__k->super_Importable).base.super_IString.str);
    this_00 = this->wasm;
    sVar5 = (pEVar2->value).super_IString.str._M_len;
    pcVar4 = (pEVar2->value).super_IString.str._M_str;
  }
  pmVar3 = std::
           map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
           ::operator[](&this->globals,(key_type *)__k);
  return pmVar3;
}

Assistant:

Literals& getGlobal(Name name) {
    auto* inst = self();
    auto* global = inst->wasm.getGlobal(name);
    while (global->imported()) {
      inst = inst->linkedInstances.at(global->module).get();
      Export* globalExport = inst->wasm.getExport(global->base);
      global = inst->wasm.getGlobal(globalExport->value);
    }

    return inst->globals[global->name];
  }